

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::member_location_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint32_t __val;
  uint32_t uVar4;
  uint uVar5;
  uint32_t comp;
  string __str;
  uint local_4c;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __val = get_member_location(this,(type->super_IVariant).self.id,index,&local_4c);
  if (__val != 0xffffffff) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    cVar3 = '\x01';
    if (9 < __val) {
      uVar4 = __val;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (uVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_002296f4;
        }
        if (uVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_002296f4;
        }
        if (uVar4 < 10000) goto LAB_002296f4;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_002296f4:
    local_48 = local_38;
    ::std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
    ::std::__detail::__to_chars_10_impl<unsigned_int>(local_48,local_40,__val);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    if (local_4c - 1 < 0xfffffffe) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      cVar3 = '\x01';
      if (9 < local_4c) {
        uVar5 = local_4c;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          if (uVar5 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_002297ad;
          }
          if (uVar5 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_002297ad;
          }
          if (uVar5 < 10000) goto LAB_002297ad;
          bVar1 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (bVar1);
        cVar3 = cVar3 + '\x01';
      }
LAB_002297ad:
      local_48 = local_38;
      ::std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
      ::std::__detail::__to_chars_10_impl<unsigned_int>(local_48,local_40,local_4c);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::member_location_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	string quals;
	uint32_t comp;
	uint32_t locn = get_member_location(type.self, index, &comp);
	if (locn != k_unknown_location)
	{
		quals += "user(locn";
		quals += convert_to_string(locn);
		if (comp != k_unknown_component && comp != 0)
		{
			quals += "_";
			quals += convert_to_string(comp);
		}
		quals += ")";
	}
	return quals;
}